

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  long *plVar8;
  int64_t iVar9;
  TPZVec<int> *in_RDX;
  TPZVec<long> *in_RSI;
  double dVar10;
  int xj_2;
  int i_2;
  TPZFNMatrix<60,_double> dphin;
  TPZFNMatrix<60,_double> phin;
  int ord;
  int xj_1;
  int c;
  int transid;
  int i_1;
  TPZManVector<long,_10> ids_1;
  TPZFMatrix<double> dphin_2;
  TPZFMatrix<double> phin_2;
  int ordin;
  int ord1;
  REAL store2_1 [60];
  REAL store1_1 [20];
  TPZVec<double> outval_1;
  int face;
  int xj;
  int i;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  int nshape;
  REAL store2 [60];
  REAL store1 [20];
  int id1;
  int id0;
  TPZManVector<double,_1> outvalvec;
  TPZVec<long> ids;
  REAL outval;
  int rib;
  int shape;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  int d;
  int is;
  bool linear;
  undefined4 in_stack_ffffffffffffe848;
  int in_stack_ffffffffffffe84c;
  TPZFMatrix<double> *in_stack_ffffffffffffe850;
  TPZFMatrix<double> *in_stack_ffffffffffffe858;
  TPZFMatrix<double> *in_stack_ffffffffffffe860;
  double *in_stack_ffffffffffffe868;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffe870;
  TPZFMatrix<double> *in_stack_ffffffffffffe878;
  TPZManVector<long,_10> *in_stack_ffffffffffffe880;
  int64_t in_stack_ffffffffffffe890;
  double *in_stack_ffffffffffffe898;
  TPZVec<double> *in_stack_ffffffffffffe8a0;
  TPZFMatrix<double> *in_stack_ffffffffffffe8a8;
  TPZFMatrix<double> *in_stack_ffffffffffffe8b0;
  TPZVec<long> *in_stack_ffffffffffffe8b8;
  TPZFMatrix<double> *in_stack_ffffffffffffe930;
  TPZFMatrix<double> *in_stack_ffffffffffffe938;
  TPZVec<double> *in_stack_ffffffffffffe940;
  int local_1528;
  int local_1524;
  TPZFMatrix<double> *in_stack_ffffffffffffed00;
  TPZFMatrix<double> *in_stack_ffffffffffffed08;
  TPZVec<double> *in_stack_ffffffffffffed10;
  int in_stack_ffffffffffffee74;
  TPZFMatrix<double> *in_stack_ffffffffffffee78;
  TPZFMatrix<double> *in_stack_ffffffffffffee80;
  int in_stack_ffffffffffffee8c;
  TPZVec<double> *in_stack_ffffffffffffee90;
  int local_1028;
  int local_101c;
  TPZVec<long> local_1018 [3];
  TPZBaseMatrix local_fa8 [4];
  TPZFMatrix<double> *in_stack_fffffffffffff0d8;
  TPZFMatrix<double> *in_stack_fffffffffffff0e0;
  int in_stack_fffffffffffff0ec;
  TPZVec<double> *in_stack_fffffffffffff0f0;
  int local_e84;
  TPZVec<double> local_bf0;
  int local_bcc;
  int local_bc8;
  int local_bc4;
  int in_stack_fffffffffffff554;
  TPZFMatrix<double> *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  int in_stack_fffffffffffff564;
  int in_stack_fffffffffffff56c;
  TPZVec<double> *in_stack_fffffffffffff570;
  TPZVec<long> local_7e8;
  int local_7bc;
  int local_7b8;
  int local_34;
  int local_30;
  byte local_29;
  TPZVec<int> *local_18;
  TPZVec<long> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  CornerShape(in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,in_stack_ffffffffffffe930);
  local_29 = 1;
  for (local_30 = 6; local_30 < 0x15; local_30 = local_30 + 1) {
    piVar6 = TPZVec<int>::operator[](local_18,(long)local_30 + -6);
    if (1 < *piVar6) {
      local_29 = 0;
    }
  }
  if ((local_29 & 1) == 0) {
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffe870,(int64_t)in_stack_ffffffffffffe868,
               (int64_t)in_stack_ffffffffffffe860);
    for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
      dVar10 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
      *pdVar7 = dVar10;
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        *pdVar7 = dVar10;
      }
    }
    ShapeGenerating(in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,in_stack_ffffffffffffed00);
    local_7b8 = 6;
    for (local_7bc = 0; local_7bc < 9; local_7bc = local_7bc + 1) {
      ProjectPoint3dPrismaToRib
                ((int)((ulong)in_stack_ffffffffffffe880 >> 0x20),
                 (TPZVec<double> *)in_stack_ffffffffffffe878,(REAL *)in_stack_ffffffffffffe870);
      TPZVec<long>::TPZVec
                ((TPZVec<long> *)in_stack_ffffffffffffe850,
                 CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848));
      TPZManVector<double,_1>::TPZManVector
                ((TPZManVector<double,_1> *)in_stack_ffffffffffffe880,
                 (int64_t)in_stack_ffffffffffffe878,(double *)in_stack_ffffffffffffe870);
      iVar5 = pztopology::TPZPrism::SideNodes[local_7bc][1];
      plVar8 = TPZVec<long>::operator[]
                         (local_10,(long)pztopology::TPZPrism::SideNodes[local_7bc][0]);
      lVar4 = *plVar8;
      plVar8 = TPZVec<long>::operator[](&local_7e8,0);
      *plVar8 = lVar4;
      plVar8 = TPZVec<long>::operator[](local_10,(long)iVar5);
      lVar4 = *plVar8;
      plVar8 = TPZVec<long>::operator[](&local_7e8,1);
      *plVar8 = lVar4;
      piVar6 = TPZVec<int>::operator[](local_18,(long)local_7bc);
      in_stack_fffffffffffff564 = *piVar6 + -1;
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_ffffffffffffe8b0,(int64_t)in_stack_ffffffffffffe8a8,
                 (int64_t)in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898,
                 in_stack_ffffffffffffe890);
      TPZFMatrix<double>::TPZFMatrix
                (in_stack_ffffffffffffe8b0,(int64_t)in_stack_ffffffffffffe8a8,
                 (int64_t)in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898,
                 in_stack_ffffffffffffe890);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe850);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe850);
      TPZVec<int>::operator[](local_18,(long)local_7bc);
      TPZShapeLinear::GetTransformId1d
                ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848));
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)in_stack_ffffffffffffe870,
                 (int)((ulong)in_stack_ffffffffffffe868 >> 0x20),in_stack_ffffffffffffe860,
                 in_stack_ffffffffffffe858,(int)((ulong)in_stack_ffffffffffffe850 >> 0x20));
      TransformDerivativeFromRibToPrisma
                ((int)((ulong)in_stack_ffffffffffffe880 >> 0x20),(int)in_stack_ffffffffffffe880,
                 in_stack_ffffffffffffe878);
      for (local_bc4 = 0; local_bc4 < in_stack_fffffffffffff564; local_bc4 = local_bc4 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        dVar1 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        *pdVar7 = dVar10 * dVar1;
        for (local_bc8 = 0; local_bc8 < 3; local_bc8 = local_bc8 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          dVar10 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          dVar1 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          dVar2 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          dVar3 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          *pdVar7 = dVar10 * dVar1 + dVar2 * dVar3;
        }
        local_7b8 = local_7b8 + 1;
      }
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188aa16);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188aa23);
      TPZManVector<double,_1>::~TPZManVector((TPZManVector<double,_1> *)in_stack_ffffffffffffe850);
      TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_ffffffffffffe850);
    }
    for (local_bcc = 0; local_bcc < 5; local_bcc = local_bcc + 1) {
      if (((local_bcc != 0) && (local_bcc != 4)) ||
         (piVar6 = TPZVec<int>::operator[](local_18,(long)(local_bcc + 9)), *piVar6 != 2)) {
        TPZVec<double>::TPZVec
                  ((TPZVec<double> *)in_stack_ffffffffffffe850,
                   CONCAT44(in_stack_ffffffffffffe84c,in_stack_ffffffffffffe848));
        ProjectPoint3dPrismaToFace
                  ((int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20),
                   (TPZVec<double> *)in_stack_ffffffffffffe8a8,in_stack_ffffffffffffe8a0);
        piVar6 = TPZVec<int>::operator[](local_18,(long)(local_bcc + 9));
        iVar5 = *piVar6;
        if (((local_bcc != 0) && (local_bcc != 4)) || (2 < iVar5)) {
          if ((local_bcc == 0) || (3 < local_bcc)) {
            local_e84 = ((iVar5 + -2) * (iVar5 + -1)) / 2;
          }
          else {
            local_e84 = (iVar5 + -1) * (iVar5 + -1);
          }
          TPZFMatrix<double>::TPZFMatrix
                    (in_stack_ffffffffffffe8b0,(int64_t)in_stack_ffffffffffffe8a8,
                     (int64_t)in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898,
                     in_stack_ffffffffffffe890);
          TPZFMatrix<double>::TPZFMatrix
                    (in_stack_ffffffffffffe8b0,(int64_t)in_stack_ffffffffffffe8a8,
                     (int64_t)in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898,
                     in_stack_ffffffffffffe890);
          TPZFMatrix<double>::Zero(in_stack_ffffffffffffe850);
          TPZFMatrix<double>::Zero(in_stack_ffffffffffffe850);
          TPZManVector<long,_10>::TPZManVector
                    ((TPZManVector<long,_10> *)in_stack_ffffffffffffe870,
                     (int64_t)in_stack_ffffffffffffe868);
          if ((local_bcc == 0) || (local_bcc == 4)) {
            for (local_101c = 0; local_101c < 3; local_101c = local_101c + 1) {
              plVar8 = TPZVec<long>::operator[]
                                 (local_10,(long)pztopology::TPZPrism::FaceNodes[local_bcc]
                                                 [local_101c]);
              lVar4 = *plVar8;
              plVar8 = TPZVec<long>::operator[](local_1018,(long)local_101c);
              *plVar8 = lVar4;
            }
          }
          else {
            for (local_101c = 0; local_101c < 4; local_101c = local_101c + 1) {
              plVar8 = TPZVec<long>::operator[]
                                 (local_10,(long)pztopology::TPZPrism::FaceNodes[local_bcc]
                                                 [local_101c]);
              lVar4 = *plVar8;
              plVar8 = TPZVec<long>::operator[](local_1018,(long)local_101c);
              *plVar8 = lVar4;
            }
          }
          if ((local_bcc == 0) || (3 < local_bcc)) {
            TPZManVector<long,_10>::Resize
                      (in_stack_ffffffffffffe880,(int64_t)in_stack_ffffffffffffe878);
            TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)in_stack_ffffffffffffe878);
            pdVar7 = TPZVec<double>::operator[](&local_bf0,0);
            dVar10 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[](&local_bf0,0);
            *pdVar7 = (dVar10 + 1.0) * 0.5;
            pdVar7 = TPZVec<double>::operator[](&local_bf0,1);
            dVar10 = *pdVar7;
            pdVar7 = TPZVec<double>::operator[](&local_bf0,1);
            *pdVar7 = (dVar10 + 1.0) * 0.5;
            TPZShapeTriang::ShapeInternal
                      (in_stack_fffffffffffff570,in_stack_fffffffffffff56c,
                       (TPZFMatrix<double> *)
                       CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                       in_stack_fffffffffffff558,in_stack_fffffffffffff554);
            iVar9 = TPZBaseMatrix::Cols(local_fa8);
            for (local_101c = 0; local_101c < (int)iVar9; local_101c = local_101c + 1) {
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              *pdVar7 = *pdVar7 * 0.5;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              *pdVar7 = *pdVar7 / 2.0;
            }
          }
          else {
            TPZShapeQuad::GetTransformId2dQ(in_stack_ffffffffffffe8b8);
            TPZShapeQuad::ShapeInternal
                      (in_stack_ffffffffffffee90,in_stack_ffffffffffffee8c,in_stack_ffffffffffffee80
                       ,in_stack_ffffffffffffee78,in_stack_ffffffffffffee74);
          }
          TransformDerivativeFromFaceToPrisma
                    ((int)((ulong)in_stack_ffffffffffffe8b0 >> 0x20),(int)in_stack_ffffffffffffe8b0,
                     in_stack_ffffffffffffe8a8);
          for (local_101c = 0; local_101c < local_e84; local_101c = local_101c + 1) {
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar10 = *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            dVar10 = dVar10 * *pdVar7;
            pdVar7 = TPZFMatrix<double>::operator()
                               (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                (int64_t)in_stack_ffffffffffffe868,
                                (int64_t)in_stack_ffffffffffffe860);
            *pdVar7 = dVar10;
            for (local_1028 = 0; local_1028 < 3; local_1028 = local_1028 + 1) {
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              dVar10 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              dVar1 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              dVar2 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              dVar3 = *pdVar7;
              pdVar7 = TPZFMatrix<double>::operator()
                                 (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_ffffffffffffe868,
                                  (int64_t)in_stack_ffffffffffffe860);
              *pdVar7 = dVar10 * dVar1 + dVar2 * dVar3;
            }
            local_7b8 = local_7b8 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)in_stack_ffffffffffffe850)
          ;
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188b3a1);
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x188b3ae);
        }
        TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_ffffffffffffe850);
      }
    }
    piVar6 = TPZVec<int>::operator[](local_18,0xe);
    if (2 < *piVar6) {
      TPZVec<int>::operator[](local_18,0xe);
      iVar5 = NConnectShapeF((int)in_stack_ffffffffffffe850,in_stack_ffffffffffffe84c);
      TPZFNMatrix<60,_double>::TPZFNMatrix
                ((TPZFNMatrix<60,_double> *)in_stack_ffffffffffffe870,
                 (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
      TPZFNMatrix<60,_double>::TPZFNMatrix
                ((TPZFNMatrix<60,_double> *)in_stack_ffffffffffffe870,
                 (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe850);
      TPZFMatrix<double>::Zero(in_stack_ffffffffffffe850);
      TPZVec<int>::operator[](local_18,0xe);
      ShapeInternal(in_stack_fffffffffffff0f0,in_stack_fffffffffffff0ec,in_stack_fffffffffffff0e0,
                    in_stack_fffffffffffff0d8);
      for (local_1524 = 0; local_1524 < iVar5; local_1524 = local_1524 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        dVar10 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        dVar10 = dVar10 * *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
        *pdVar7 = dVar10;
        for (local_1528 = 0; local_1528 < 3; local_1528 = local_1528 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          dVar10 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          in_stack_ffffffffffffe870 = (TPZFNMatrix<100,_double> *)*pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             ((TPZFMatrix<double> *)in_stack_ffffffffffffe870,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          in_stack_ffffffffffffe860 = (TPZFMatrix<double> *)*pdVar7;
          in_stack_ffffffffffffe868 =
               TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860);
          dVar10 = dVar10 * (double)in_stack_ffffffffffffe870 +
                   (double)in_stack_ffffffffffffe860 * *in_stack_ffffffffffffe868;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffe870->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffe868,(int64_t)in_stack_ffffffffffffe860)
          ;
          *pdVar7 = dVar10;
        }
        local_7b8 = local_7b8 + 1;
      }
      TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)0x188b7aa);
      TPZFNMatrix<60,_double>::~TPZFNMatrix((TPZFNMatrix<60,_double> *)0x188b7b7);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x188b7cf);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x188b7dc);
  }
  return;
}

Assistant:

void TPZShapePrism::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[14]<2) return;//order tem as ordens dos lados do elemento
		int shape = 6;
		//rib shapes
		for (int rib = 0; rib < 9; rib++) {//todas as arestas
			REAL outval;
			ProjectPoint3dPrismaToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPrisma(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+6,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+6)  * phin( i, 0) +
					phiblend(rib+6, 0 )   * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[14]<2) return;//ordem do elemento
		//face shapes
		for (int face = 0; face < 5; face++) {
			
			if((face==0 || face==4) && order[face+9]==2) continue;//estas face nao tem shapes associadas com ordem p=2
			TPZVec<REAL> outval(2);
			ProjectPoint3dPrismaToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			ord1 = order[face+9];
			//ord2 = ord1;
			//elpr->FaceOrder(face,ord1,ord2);//ordem da face
			if((face==0 || face==4) && ord1<3) continue;//uma face triangular com ordem < 3 n�o tem shape associada
			int ordin;
			if(face && face<4) ordin = (ord1-1)*(ord1-1);//faces quadrilaterais
			else ordin = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2
			int i;
			if(face ==0 || face == 4) for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face x
			//    id1 = ShapeFaceId[face][1];//que compoem a shape atual
			//    id2 = ShapeFaceId[face][2];
			int transid;
			if(face && face<4) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					//dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPrisma(face,ordin,dphin);//ordin = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+15,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+15) * phin(i ,0) +
					phiblend(face+15, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[14]<3) return;
		//volume shapes
		int ord=0;
		ord = NConnectShapeF(20,order[20-NCornerNodes]);
		TPZFNMatrix<60> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[14],phin,dphin);
		for(int i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1)* phin(i ,0) +
				phiblend(NSides-1, 0)* dphin(xj,i);
			}
			shape++;
		}
		
		//}//while
		
	}